

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  type_info *tp;
  function_record *pfVar3;
  uint __val;
  _Alloc_hider _Var4;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  type_info *ptVar10;
  function_record *pfVar11;
  function_record *pfVar12;
  PyMappingMethods *pPVar13;
  PyMethodDef *pPVar14;
  PyObject *pPVar15;
  long *plVar16;
  PyObject *pPVar17;
  object *poVar18;
  ulong uVar19;
  PyTypeObject *pPVar20;
  ulong uVar21;
  size_type *psVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  PyAsyncMethods *pPVar24;
  object *object;
  uint uVar25;
  pointer paVar26;
  PyBufferProcs *pPVar27;
  long lVar28;
  char cVar29;
  long lVar30;
  long lVar31;
  cpp_function *pcVar32;
  uint __len;
  function_record *value;
  bool bVar33;
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  function_record *local_1a0;
  allocator local_191;
  type_info **local_190;
  setattrfunc local_188;
  undefined1 local_180 [32];
  PyMappingMethods *local_160;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_158;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_138;
  PyBufferProcs *local_130;
  cpp_function *local_128;
  handle local_120;
  str local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pcVar9 = "";
  if (rec->name != (char *)0x0) {
    pcVar9 = rec->name;
  }
  local_190 = types;
  local_130 = (PyBufferProcs *)args;
  local_128 = this;
  pcVar9 = strdup(pcVar9);
  rec->name = pcVar9;
  if (rec->doc != (char *)0x0) {
    pcVar9 = strdup(rec->doc);
    rec->doc = pcVar9;
  }
  paVar26 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1a0 = rec;
  if (paVar26 != paVar2) {
    do {
      if (*(char **)paVar26 != (char *)0x0) {
        pcVar9 = strdup(*(char **)paVar26);
        *(char **)paVar26 = pcVar9;
      }
      if (*(char **)(paVar26 + 8) == (char *)0x0) {
        if (*(PyObject **)(paVar26 + 0x10) != (PyObject *)0x0) {
          local_1d0._0_8_ = "__repr__";
          local_1d0._8_8_ = 0;
          local_1e0._8_8_ = *(PyObject **)(paVar26 + 0x10);
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&local_1c0);
          cast<std::__cxx11::string>(&local_158,(pybind11 *)&local_1c0,object);
          _Var4._M_p = local_158._M_dataplus._M_p;
          pcVar9 = strdup(local_158._M_dataplus._M_p);
          *(char **)(paVar26 + 8) = pcVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p != &local_158.field_2) {
            operator_delete(_Var4._M_p,
                            CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                     local_158.field_2._M_local_buf[0]) + 1);
          }
          pybind11::object::~object((object *)&local_1c0);
          pybind11::object::~object((object *)(local_1d0 + 8));
        }
      }
      else {
        pcVar9 = strdup(*(char **)(paVar26 + 8));
        *(char **)(paVar26 + 8) = pcVar9;
      }
      paVar26 = paVar26 + 0x20;
    } while (paVar26 != paVar2);
  }
  local_138 = &local_1a0->args;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_160 = (PyMappingMethods *)local_1d0;
  pPVar27 = (PyBufferProcs *)0x0;
  local_188 = (setattrfunc)0x0;
  lVar30 = 0;
LAB_00114a16:
  lVar28 = 0;
  lVar31 = lVar30;
LAB_00114a1b:
  lVar30 = lVar31 + 1;
  bVar1 = text[lVar31];
  lVar31 = lVar30;
  if (0x7a < bVar1) {
    if (bVar1 != 0x7d) {
      if (bVar1 != 0x7b) goto LAB_00114a48;
      if ((lVar28 == 0) && (text[lVar30] != '*' && pPVar27 < local_130)) {
        paVar26 = (local_1a0->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((paVar26 ==
              (local_1a0->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (*(long *)(paVar26 + (long)pPVar27 * 0x20) == 0)) &&
           ((local_1a0->field_0x59 & 0x20) == 0 || pPVar27 != (PyBufferProcs *)0x0)) {
          uVar21 = (long)pPVar27 - (ulong)(((byte)local_1a0->field_0x59 >> 5 & 1) != 0);
          cVar29 = '\x01';
          if (9 < uVar21) {
            uVar19 = uVar21;
            cVar6 = '\x04';
            do {
              cVar29 = cVar6;
              if (uVar19 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00114bfb;
              }
              if (uVar19 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00114bfb;
              }
              if (uVar19 < 10000) goto LAB_00114bfb;
              bVar33 = 99999 < uVar19;
              uVar19 = uVar19 / 10000;
              cVar6 = cVar29 + '\x04';
            } while (bVar33);
            cVar29 = cVar29 + '\x01';
          }
LAB_00114bfb:
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1c0,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1c0._M_dataplus._M_p,(uint)local_1c0._M_string_length,uVar21);
          plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x11c9df);
          local_1e0._0_8_ = local_1d0;
          pPVar20 = (PyTypeObject *)(plVar16 + 2);
          if ((PyTypeObject *)*plVar16 == pPVar20) {
            local_1d0._0_8_ = (pPVar20->ob_base).ob_base.ob_refcnt;
            local_1d0._8_8_ = plVar16[3];
          }
          else {
            local_1d0._0_8_ = (pPVar20->ob_base).ob_base.ob_refcnt;
            local_1e0._0_8_ = (PyTypeObject *)*plVar16;
          }
          local_1e0._8_8_ = plVar16[1];
          *plVar16 = (long)pPVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_158,local_1e0._0_8_);
          if ((PyTypeObject *)local_1e0._0_8_ != (PyTypeObject *)local_1d0) {
            operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_158);
        }
        std::__cxx11::string::append((char *)&local_158);
      }
      lVar28 = lVar28 + 1;
      goto LAB_00114a1b;
    }
    lVar28 = lVar28 + -1;
    if (lVar28 == 0) goto LAB_00114ce6;
    goto LAB_00114a1b;
  }
  if (bVar1 != 0) {
    if (bVar1 == 0x25) {
      tp = local_190[(long)local_188];
      if (tp == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      ptVar10 = detail::get_type_info(tp,false);
      local_188 = local_188 + 1;
      if (ptVar10 == (type_info *)0x0) {
        std::__cxx11::string::string
                  ((string *)local_1e0,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                   (allocator *)&local_1c0);
        detail::clean_type_id((string *)local_1e0);
        std::__cxx11::string::_M_append((char *)&local_158,local_1e0._0_8_);
        if ((PyTypeObject *)local_1e0._0_8_ != (PyTypeObject *)local_1d0) {
          operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._0_8_ + 1));
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_158);
      }
    }
    else {
LAB_00114a48:
      std::__cxx11::string::push_back((char)&local_158);
    }
    goto LAB_00114a1b;
  }
  if ((lVar28 != 0) || (local_190[(long)local_188] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup(local_158._M_dataplus._M_p);
  pcVar32 = local_128;
  value = local_1a0;
  local_1a0->signature = pcVar9;
  if ((local_1a0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_1a0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_138);
  }
  pcVar9 = value->name;
  iVar7 = strcmp(pcVar9,"__init__");
  if (iVar7 == 0) {
    bVar33 = true;
  }
  else {
    iVar7 = strcmp(pcVar9,"__setstate__");
    bVar33 = iVar7 == 0;
  }
  value->field_0x59 = value->field_0x59 & 0xfe | bVar33;
  value->nargs = (uint16_t)local_130;
  pPVar15 = (value->sibling).m_ptr;
  if (pPVar15 != (PyObject *)0x0) {
    if (pPVar15->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar15 = (PyObject *)pPVar15[1].ob_refcnt;
      (value->sibling).m_ptr = pPVar15;
      if (pPVar15 == (PyObject *)0x0) goto LAB_00114f2f;
    }
    if (pPVar15->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar7 = PyType_IsSubtype(pPVar15->ob_type,&PyCFunction_Type);
      pPVar15 = (value->sibling).m_ptr;
      if (iVar7 == 0) {
        if ((pPVar15 != (PyObject *)&_Py_NoneStruct) && (*value->name != '_')) {
          std::__cxx11::string::string((string *)local_180,value->name,(allocator *)&local_110);
          std::operator+(&local_1c0,"Cannot overload existing non-function object \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_180);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_1c0);
          local_1e0._0_8_ = *plVar16;
          psVar22 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_1e0._0_8_ == psVar22) {
            local_1d0._0_8_ = *psVar22;
            local_1d0._8_8_ = plVar16[3];
            local_1e0._0_8_ = local_1d0;
          }
          else {
            local_1d0._0_8_ = *psVar22;
          }
          local_1e0._8_8_ = plVar16[1];
          *plVar16 = (long)psVar22;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          pybind11_fail((string *)local_1e0);
        }
        goto LAB_00114f2f;
      }
    }
    if ((*(byte *)(pPVar15[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1e0._0_8_ = pPVar15[1].ob_type;
      if ((PyTypeObject *)local_1e0._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_1e0._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_1e0._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
    }
    else {
      local_1e0._0_8_ = (PyTypeObject *)0x0;
    }
    pfVar11 = capsule::operator_cast_to_function_record_((capsule *)local_1e0);
    pPVar15 = (pfVar11->scope).m_ptr;
    pPVar17 = (value->scope).m_ptr;
    pybind11::object::~object((object *)local_1e0);
    if (pPVar15 == pPVar17) {
      pPVar15 = (value->sibling).m_ptr;
      (pcVar32->super_function).super_object.super_handle.m_ptr = pPVar15;
      if (pPVar15 != (PyObject *)0x0) {
        pPVar15->ob_refcnt = pPVar15->ob_refcnt + 1;
      }
      bVar1 = value->field_0x59;
      pfVar3 = pfVar11;
      if (((pfVar11->field_0x59 ^ bVar1) & 0x20) != 0) {
        pcVar9 = "instance";
        if ((bVar1 & 0x20) == 0) {
          pcVar9 = "static";
        }
        local_d0._0_8_ = local_d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,pcVar9,pcVar9 + (ulong)((bVar1 & 0x20) >> 5) * 2 + 6);
        std::operator+(&local_70,
                       "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d0);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_f0._M_dataplus._M_p = (pointer)*plVar16;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == paVar23) {
          local_f0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_f0.field_2._8_8_ = plVar16[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
        }
        local_f0._M_string_length = plVar16[1];
        *plVar16 = (long)paVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_50.obj.m_ptr = (local_1a0->scope).m_ptr;
        local_50.key = "__name__";
        local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        poVar18 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            (&local_50);
        local_120.m_ptr = (poVar18->super_handle).m_ptr;
        if (local_120.m_ptr != (PyObject *)0x0) {
          (local_120.m_ptr)->ob_refcnt = (local_120.m_ptr)->ob_refcnt + 1;
        }
        str::str(&local_118,(object *)&local_120);
        str::operator_cast_to_string(&local_90,&local_118);
        std::operator+(&local_110,&local_f0,&local_90);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_180._0_8_ = *plVar16;
        pPVar24 = (PyAsyncMethods *)(plVar16 + 2);
        if ((PyAsyncMethods *)local_180._0_8_ == pPVar24) {
          local_180._16_8_ = pPVar24->am_await;
          local_180._24_8_ = plVar16[3];
          local_180._0_8_ = (PyObject *)(local_180 + 0x10);
        }
        else {
          local_180._16_8_ = pPVar24->am_await;
        }
        local_180._8_8_ = plVar16[1];
        *plVar16 = (long)pPVar24;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::__cxx11::string::string((string *)&local_b0,local_1a0->name,&local_191);
        std::operator+(&local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180,&local_b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,&local_1c0,&local_158);
        pybind11_fail((string *)local_1e0);
      }
      do {
        pfVar12 = pfVar3;
        pfVar3 = pfVar12->next;
      } while (pfVar3 != (function_record *)0x0);
      pfVar12->next = value;
      local_1e0._0_8_ = local_1d0;
      local_1e0._8_8_ = (PyObject *)0x0;
      local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
      pPVar13 = (PyMappingMethods *)&options::global_state()::instance;
      if (DAT_001239d9 == 1) {
        std::__cxx11::string::append(local_1e0);
        std::__cxx11::string::append(local_1e0);
        pPVar13 = (PyMappingMethods *)std::__cxx11::string::append(local_1e0);
      }
      if (pfVar11 != (function_record *)0x0) {
        bVar33 = false;
LAB_00115089:
        iVar7 = 0;
        local_190 = (type_info **)
                    CONCAT44(local_190._4_4_,(int)CONCAT71((int7)((ulong)pPVar13 >> 8),1));
        do {
          if (DAT_001239d9 == 1) {
            if (0 < iVar7) {
              std::__cxx11::string::append(local_1e0);
            }
            if (!bVar33) {
              uVar25 = iVar7 + 1;
              local_188 = (setattrfunc)CONCAT44(local_188._4_4_,uVar25);
              __val = -uVar25;
              if (0 < (int)uVar25) {
                __val = uVar25;
              }
              __len = 1;
              if (9 < __val) {
                uVar21 = (ulong)__val;
                uVar5 = 4;
                do {
                  __len = uVar5;
                  uVar8 = (uint)uVar21;
                  if (uVar8 < 100) {
                    __len = __len - 2;
                    goto LAB_00115123;
                  }
                  if (uVar8 < 1000) {
                    __len = __len - 1;
                    goto LAB_00115123;
                  }
                  if (uVar8 < 10000) goto LAB_00115123;
                  uVar21 = uVar21 / 10000;
                  uVar5 = __len + 4;
                } while (99999 < uVar8);
                __len = __len + 1;
              }
LAB_00115123:
              local_180._0_8_ = local_180 + 0x10;
              std::__cxx11::string::_M_construct
                        ((ulong)local_180,(char)__len - (char)((int)uVar25 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)(local_180._0_8_ + (ulong)(uVar25 >> 0x1f)),__len,__val);
              plVar16 = (long *)std::__cxx11::string::append(local_180);
              value = local_1a0;
              psVar22 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_1c0.field_2._M_allocated_capacity = *psVar22;
                local_1c0.field_2._8_8_ = plVar16[3];
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              }
              else {
                local_1c0.field_2._M_allocated_capacity = *psVar22;
                local_1c0._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_1c0._M_string_length = plVar16[1];
              *plVar16 = (long)psVar22;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::string::_M_append(local_1e0,(ulong)local_1c0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if ((PyAsyncMethods *)local_180._0_8_ != (PyAsyncMethods *)(local_180 + 0x10)) {
                operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
              }
              iVar7 = (int)local_188;
            }
            std::__cxx11::string::append(local_1e0);
            std::__cxx11::string::append(local_1e0);
            std::__cxx11::string::append(local_1e0);
          }
          if (((pfVar11->doc != (char *)0x0) && (*pfVar11->doc != '\0')) &&
             (options::global_state()::instance == '\x01')) {
            if (((DAT_001239d9 | (byte)local_190) & 1) == 0) {
              std::__cxx11::string::append(local_1e0);
              local_190 = (type_info **)((ulong)local_190 & 0xffffffff00000000);
            }
            else {
              local_190 = (type_info **)
                          CONCAT44(local_190._4_4_,
                                   CONCAT31((int3)((ulong)local_190 >> 8),
                                            (byte)local_190 & DAT_001239d9));
            }
            if ((DAT_001239d9 & 1) != 0) {
              std::__cxx11::string::append(local_1e0);
            }
            std::__cxx11::string::append(local_1e0);
            if (DAT_001239d9 == 1) {
              std::__cxx11::string::append(local_1e0);
            }
          }
          pfVar11 = pfVar11->next;
          pcVar32 = local_128;
        } while (pfVar11 != (function_record *)0x0);
      }
      pPVar15 = (pcVar32->super_function).super_object.super_handle.m_ptr;
      lVar30 = pPVar15[1].ob_refcnt;
      if (*(void **)(lVar30 + 0x18) != (void *)0x0) {
        free(*(void **)(lVar30 + 0x18));
        lVar30 = pPVar15[1].ob_refcnt;
      }
      pcVar9 = strdup((char *)local_1e0._0_8_);
      pPVar13 = local_160;
      *(char **)(lVar30 + 0x18) = pcVar9;
      if ((value->field_0x59 & 0x20) != 0) {
        pPVar17 = (PyObject *)
                  PyInstanceMethod_New((pcVar32->super_function).super_object.super_handle.m_ptr);
        (pcVar32->super_function).super_object.super_handle.m_ptr = pPVar17;
        if (pPVar17 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar15->ob_refcnt = pPVar15->ob_refcnt + -1;
        if (pPVar15->ob_refcnt == 0) {
          _Py_Dealloc(pPVar15);
        }
      }
      if ((PyMappingMethods *)local_1e0._0_8_ != pPVar13) {
        operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  }
LAB_00114f2f:
  pPVar14 = (PyMethodDef *)operator_new(0x20);
  value->def = pPVar14;
  *(undefined8 *)&pPVar14->ml_flags = 0;
  pPVar14->ml_doc = (char *)0x0;
  pPVar14->ml_name = value->name;
  pPVar14->ml_meth = dispatcher;
  pPVar14->ml_flags = 3;
  capsule::capsule((capsule *)&local_1c0,value,initialize_generic::anon_class_1_0_00000001::__invoke
                  );
  local_180._0_8_ = (PyObject *)0x0;
  pPVar15 = (value->scope).m_ptr;
  if (pPVar15 != (PyObject *)0x0) {
    iVar7 = PyObject_HasAttrString(pPVar15,"__module__");
    if (iVar7 == 1) {
      local_1e0._8_8_ = (value->scope).m_ptr;
      local_1d0._0_8_ = "__module__";
      local_1d0._8_8_ = 0;
      poVar18 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1e0);
    }
    else {
      iVar7 = PyObject_HasAttrString((value->scope).m_ptr,"__name__");
      if (iVar7 != 1) goto LAB_00115031;
      local_1e0._8_8_ = (value->scope).m_ptr;
      local_1d0._0_8_ = "__name__";
      local_1d0._8_8_ = 0;
      poVar18 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1e0);
    }
    local_110._M_dataplus._M_p = (pointer)(poVar18->super_handle).m_ptr;
    if ((PyObject *)local_110._M_dataplus._M_p != (PyObject *)0x0) {
      ((PyObject *)local_110._M_dataplus._M_p)->ob_refcnt =
           ((PyObject *)local_110._M_dataplus._M_p)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)local_180,(object *)&local_110);
    pybind11::object::~object((object *)&local_110);
    pybind11::object::~object((object *)(local_1d0 + 8));
  }
LAB_00115031:
  pPVar15 = (PyObject *)PyCMethod_New(value->def,local_1c0._M_dataplus._M_p,local_180._0_8_,0);
  (pcVar32->super_function).super_object.super_handle.m_ptr = pPVar15;
  if (pPVar15 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)local_180);
  pybind11::object::~object((object *)&local_1c0);
  pPVar13 = (PyMappingMethods *)local_1d0;
  local_1e0._8_8_ = (PyObject *)0x0;
  local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
  bVar33 = true;
  pfVar11 = value;
  local_1e0._0_8_ = pPVar13;
  local_160 = pPVar13;
  goto LAB_00115089;
LAB_00114ce6:
  paVar26 = (local_1a0->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar27 < (PyBufferProcs *)
                 ((long)(local_1a0->args).
                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar26 >> 5)) &&
     (*(long *)(paVar26 + (long)pPVar27 * 0x20 + 8) != 0)) {
    std::__cxx11::string::append((char *)&local_158);
    std::__cxx11::string::append((char *)&local_158);
  }
  pPVar27 = (PyBufferProcs *)((long)&pPVar27->bf_getbuffer + 1);
  goto LAB_00114a16;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty() && rec->args[arg_index].name) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CONSTEXPR_DESCR)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }